

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
fmt::v6::detail::container_buffer<fmt::v6::detail::buffer<char>_>::grow
          (container_buffer<fmt::v6::detail::buffer<char>_> *this,size_t capacity)

{
  buffer<char>::resize(this->container_,capacity);
  (this->super_buffer<char>).ptr_ = this->container_->ptr_;
  (this->super_buffer<char>).capacity_ = capacity;
  return;
}

Assistant:

void grow(size_t capacity) FMT_OVERRIDE {
    container_.resize(capacity);
    this->set(&container_[0], capacity);
  }